

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CuTest.c
# Opt level: O3

void CuSuiteSummary(CuSuite *testSuite,CuString *summary)

{
  char *text;
  long lVar1;
  
  if (0 < testSuite->count) {
    lVar1 = 0;
    do {
      text = "F";
      if ((testSuite->list[lVar1]->failed == 0) &&
         (text = ".", testSuite->list[lVar1]->notImplemented != 0)) {
        text = "N";
      }
      CuStringAppend(summary,text);
      lVar1 = lVar1 + 1;
    } while (lVar1 < testSuite->count);
  }
  CuStringAppend(summary,"\n\n");
  return;
}

Assistant:

void CuSuiteSummary(CuSuite* testSuite, CuString* summary)
{
	int i;
	char* str;

	for (i = 0 ; i < testSuite->count ; ++i)
	{
		CuTest* testCase = testSuite->list[i];

		if (testCase->failed)
			str = "F";
		else if (testCase->notImplemented)
			str = "N";
		else
			str = ".";

		CuStringAppend(summary, str);
	}
	CuStringAppend(summary, "\n\n");
}